

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ExplicitNonAnsiPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExplicitNonAnsiPortSyntax,slang::syntax::ExplicitNonAnsiPortSyntax_const&>
          (BumpAllocator *this,ExplicitNonAnsiPortSyntax *args)

{
  undefined4 uVar1;
  ExplicitNonAnsiPortSyntax *pEVar2;
  long lVar3;
  ExplicitNonAnsiPortSyntax *pEVar4;
  byte bVar5;
  
  bVar5 = 0;
  pEVar2 = (ExplicitNonAnsiPortSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ExplicitNonAnsiPortSyntax *)this->endPtr < pEVar2 + 1) {
    pEVar2 = (ExplicitNonAnsiPortSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pEVar2 + 1);
  }
  pEVar4 = pEVar2;
  for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)&(args->super_NonAnsiPortSyntax).super_SyntaxNode.field_0x4;
    (pEVar4->super_NonAnsiPortSyntax).super_SyntaxNode.kind =
         (args->super_NonAnsiPortSyntax).super_SyntaxNode.kind;
    *(undefined4 *)&(pEVar4->super_NonAnsiPortSyntax).super_SyntaxNode.field_0x4 = uVar1;
    args = (ExplicitNonAnsiPortSyntax *)((long)args + (ulong)bVar5 * -0x10 + 8);
    pEVar4 = (ExplicitNonAnsiPortSyntax *)((long)pEVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return pEVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }